

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FileOptions::Clear(FileOptions *this)

{
  uint uVar1;
  ulong uVar2;
  FeatureSet *this_00;
  undefined8 *puVar3;
  char *failure_msg;
  int line;
  char *file;
  LogMessageFatal local_20;
  
  internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
            (&(this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase);
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) == 0) {
LAB_0020b1f9:
      if ((uVar1 & 2) != 0) {
        uVar2 = *(ulong *)((long)&this->field_0 + 0x40);
        if ((uVar2 & 3) == 0) goto LAB_0020b3c9;
        puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        puVar3[1] = 0;
        *(undefined1 *)*puVar3 = 0;
      }
      if ((uVar1 & 4) != 0) {
        uVar2 = *(ulong *)((long)&this->field_0 + 0x48);
        if ((uVar2 & 3) == 0) goto LAB_0020b3c9;
        puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        puVar3[1] = 0;
        *(undefined1 *)*puVar3 = 0;
      }
      if ((uVar1 & 8) != 0) {
        uVar2 = *(ulong *)((long)&this->field_0 + 0x50);
        if ((uVar2 & 3) == 0) goto LAB_0020b3c9;
        puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        puVar3[1] = 0;
        *(undefined1 *)*puVar3 = 0;
      }
      if ((uVar1 & 0x10) != 0) {
        uVar2 = *(ulong *)((long)&this->field_0 + 0x58);
        if ((uVar2 & 3) == 0) goto LAB_0020b3c9;
        puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        puVar3[1] = 0;
        *(undefined1 *)*puVar3 = 0;
      }
      if ((uVar1 & 0x20) != 0) {
        uVar2 = *(ulong *)((long)&this->field_0 + 0x60);
        if ((uVar2 & 3) == 0) goto LAB_0020b3c9;
        puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        puVar3[1] = 0;
        *(undefined1 *)*puVar3 = 0;
      }
      if ((uVar1 & 0x40) != 0) {
        uVar2 = *(ulong *)((long)&this->field_0 + 0x68);
        if ((uVar2 & 3) == 0) goto LAB_0020b3c9;
        puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        puVar3[1] = 0;
        *(undefined1 *)*puVar3 = 0;
      }
      if ((char)uVar1 < '\0') {
        uVar2 = *(ulong *)((long)&this->field_0 + 0x70);
        if ((uVar2 & 3) == 0) goto LAB_0020b3c9;
        puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        puVar3[1] = 0;
        *(undefined1 *)*puVar3 = 0;
      }
      goto LAB_0020b2f7;
    }
    uVar2 = *(ulong *)((long)&this->field_0 + 0x38);
    if ((uVar2 & 3) != 0) {
      puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
      goto LAB_0020b1f9;
    }
LAB_0020b3c9:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
    ;
    failure_msg = "!tagged_ptr_.IsDefault()";
    line = 0x20b;
LAB_0020b3e4:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_20,file,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
  }
LAB_0020b2f7:
  if ((uVar1 & 0x700) == 0) goto LAB_0020b368;
  if ((uVar1 >> 8 & 1) != 0) {
    uVar2 = *(ulong *)((long)&this->field_0 + 0x78);
    if ((uVar2 & 3) == 0) goto LAB_0020b3c9;
    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    puVar3[1] = 0;
    *(undefined1 *)*puVar3 = 0;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    uVar2 = *(ulong *)((long)&this->field_0 + 0x80);
    if ((uVar2 & 3) == 0) goto LAB_0020b3c9;
    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    puVar3[1] = 0;
    *(undefined1 *)*puVar3 = 0;
  }
  if ((uVar1 >> 10 & 1) != 0) {
    this_00 = (this->field_0)._impl_.features_;
    if (this_00 == (FeatureSet *)0x0) {
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
      ;
      failure_msg = "_impl_.features_ != nullptr";
      line = 0x20b6;
      goto LAB_0020b3e4;
    }
    FeatureSet::Clear(this_00);
  }
LAB_0020b368:
  if ((uVar1 & 0xf800) != 0) {
    (this->field_0)._impl_.java_generate_equals_and_hash_ = false;
    *(undefined4 *)((long)&this->field_0 + 0x90) = 0;
  }
  if ((uVar1 & 0xf0000) != 0) {
    *(undefined2 *)((long)&this->field_0 + 0x95) = 0;
    (this->field_0)._impl_.optimize_for_ = 1;
    (this->field_0)._impl_.cc_enable_arenas_ = true;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void FileOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FileOptions)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.uninterpreted_option_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.java_package_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.java_outer_classname_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.go_package_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _impl_.objc_class_prefix_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _impl_.csharp_namespace_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _impl_.swift_prefix_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _impl_.php_class_prefix_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _impl_.php_namespace_.ClearNonDefaultToEmpty();
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _impl_.php_metadata_namespace_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _impl_.ruby_package_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      ABSL_DCHECK(_impl_.features_ != nullptr);
      _impl_.features_->Clear();
    }
  }
  if ((cached_has_bits & 0x0000f800u) != 0) {
    ::memset(&_impl_.java_multiple_files_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.java_generate_equals_and_hash_) -
        reinterpret_cast<char*>(&_impl_.java_multiple_files_)) + sizeof(_impl_.java_generate_equals_and_hash_));
  }
  if ((cached_has_bits & 0x000f0000u) != 0) {
    ::memset(&_impl_.deprecated_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.java_string_check_utf8_) -
        reinterpret_cast<char*>(&_impl_.deprecated_)) + sizeof(_impl_.java_string_check_utf8_));
    _impl_.optimize_for_ = 1;
    _impl_.cc_enable_arenas_ = true;
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}